

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

boolean is_lava(level *lev,int x,int y)

{
  char cVar1;
  schar ltyp;
  int y_local;
  int x_local;
  level *lev_local;
  
  if ((((x < 1) || (0x4f < x)) || (y < 0)) || (0x14 < y)) {
    lev_local._7_1_ = '\0';
  }
  else {
    cVar1 = lev->locations[x][y].typ;
    if ((cVar1 == '\x15') ||
       ((cVar1 == '\x14' && ((*(uint *)&lev->locations[x][y].field_0x6 >> 4 & 0x1c) == 4)))) {
      lev_local._7_1_ = '\x01';
    }
    else {
      lev_local._7_1_ = '\0';
    }
  }
  return lev_local._7_1_;
}

Assistant:

boolean is_lava(struct level *lev, int x, int y)
{
    schar ltyp;

    if (!isok(x,y)) return FALSE;
    ltyp = lev->locations[x][y].typ;
    if (ltyp == LAVAPOOL
	|| (ltyp == DRAWBRIDGE_UP
	    && (lev->locations[x][y].drawbridgemask & DB_UNDER) == DB_LAVA)) return TRUE;
    return FALSE;
}